

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw_style.h
# Opt level: O2

void __thiscall CGL::GLScene::DrawStyle::style_vertex(DrawStyle *this)

{
  glColor4fv();
  glPointSize(this->vertexRadius);
  return;
}

Assistant:

void style_vertex() const {
    GLfloat temp[4];
    temp[0] = vertexColor.r;
    temp[1] = vertexColor.g;
    temp[2] = vertexColor.b;
    temp[3] = 1.f;
    glColor4fv(temp);
    glPointSize(vertexRadius);
  }